

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptArray::SetLastUsedSegment(JavascriptArray *this,SparseArraySegmentBase *segment)

{
  DynamicObjectFlags DVar1;
  Type *addr;
  
  DVar1 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  addr = (Type *)((long)this->segmentUnion + 0x20);
  if ((DVar1 & HasSegmentMap) == None) {
    addr = &this->segmentUnion;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  *addr = (Type)segment;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void JavascriptArray::SetLastUsedSegment(SparseArraySegmentBase * segment)
    {
        if (HasSegmentMap())
        {
            this->segmentUnion.segmentBTreeRoot->lastUsedSegment = segment;
        }
        else
        {
            this->segmentUnion.lastUsedSegment = segment;
        }
    }